

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wifi_impl.cpp
# Opt level: O0

void __thiscall ui::anon_unknown_0::WiFiImpl::RefreshNetworkList(WiFiImpl *this)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  mapped_type *pmVar4;
  string *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> unique_name;
  size_type act_pos;
  string local_188;
  allocator<char> local_161;
  string local_160;
  string local_140;
  undefined1 local_120 [8];
  string name;
  size_type pos;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  undefined1 local_88 [8];
  string current_line;
  size_t newline_pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp_start;
  undefined1 local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> mac_address;
  WiFiImpl *this_local;
  
  mac_address.field_2._8_8_ = this;
  bVar1 = WifiStatus(this);
  if (!bVar1) {
    shell_helper("connmanctl enable wifi");
  }
  shell_helper("connmanctl scan wifi");
  result = &this->result;
  shell_helper("cat /sys/class/net/wlan0/address | sed  -r \'s/^([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2})$/\\1\\2\\3\\4\\5\\6/\'"
               ,result);
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_30,(ulong)result);
  shell_helper("connmanctl services | sed -e \'s/[ \t]*//\'",result);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&newline_pos,
                 "wifi_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_30);
  while (lVar2 = std::__cxx11::string::length(), lVar2 != 0) {
    current_line.field_2._8_8_ = 1;
    lVar2 = std::__cxx11::string::find((char *)&this->result,0x1c78b9);
    if (lVar2 != -1) {
      current_line.field_2._8_8_ = std::__cxx11::string::find((char *)&this->result,0x1c78b9);
      std::__cxx11::string::substr((ulong)&local_a8,(ulong)&this->result);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8," ",&local_c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0," \t",(allocator<char> *)((long)&pos + 7));
      reduce((string *)local_88,&local_a8,&local_c8,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
      std::__cxx11::string::~string((string *)&local_a8);
      name.field_2._8_8_ = std::__cxx11::string::find((string *)local_88,(ulong)&newline_pos);
      if (name.field_2._8_8_ != -1) {
        if (name.field_2._8_8_ == 0) {
          std::__cxx11::string::substr((ulong)&local_1f8,(ulong)local_88);
          std::operator+(&local_1d8,"hidden - ",&local_1f8);
          pmVar4 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->service_names,&local_1d8);
          std::__cxx11::string::operator=((string *)pmVar4,(string *)local_88);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_1f8);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_140,(ulong)local_88);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_160," ",&local_161);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_188," \t",(allocator<char> *)((long)&act_pos + 7));
          reduce((string *)local_120,&local_140,&local_160,&local_188);
          std::__cxx11::string::~string((string *)&local_188);
          std::allocator<char>::~allocator((allocator<char> *)((long)&act_pos + 7));
          std::__cxx11::string::~string((string *)&local_160);
          std::allocator<char>::~allocator(&local_161);
          std::__cxx11::string::~string((string *)&local_140);
          uVar3 = std::__cxx11::string::find(local_120,0x1c485e);
          unique_name.field_2._8_8_ = uVar3;
          if (uVar3 != 0xffffffffffffffff) {
            std::__cxx11::string::find_first_of(local_120,0x1c3e5e);
            std::__cxx11::string::erase((ulong)local_120,uVar3);
            std::__cxx11::string::operator=((string *)&this->active_name,(string *)local_120);
          }
          std::__cxx11::string::substr((ulong)local_1b8,(ulong)local_88);
          pmVar4 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->service_names,(key_type *)local_120);
          std::__cxx11::string::operator=((string *)pmVar4,local_1b8);
          std::__cxx11::string::~string(local_1b8);
          std::__cxx11::string::~string((string *)local_120);
        }
      }
      std::__cxx11::string::~string((string *)local_88);
    }
    std::__cxx11::string::erase((ulong)&this->result,0);
  }
  std::__cxx11::string::~string((string *)&newline_pos);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void RefreshNetworkList() {
    if (!WifiStatus()) {
      /* Enable wifi */
      shell_helper("connmanctl enable wifi");
    }

    /* Scan wifi */
    shell_helper("connmanctl scan wifi");

    /* Get mac address formatted into continuous string */
    shell_helper(
        "cat /sys/class/net/wlan0/address | sed  -r "
        "'s/^([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2})$/"
        "\\1\\2\\3\\4\\5\\6/'",
        &result);

    /* Get macaddress from trailing spaces */
    auto mac_address = result.substr(0, result.length() - 2);

    /* Get connman services */
    shell_helper("connmanctl services | sed -e 's/[ \t]*//'", &result);

    /* Temporary string to store wifi_macaddress*/
    auto temp_start = "wifi_" + mac_address;

    while (true) {
      if (result.length() == 0) {
        break;
      }

      /* Position of newline character */
      size_t newline_pos = 1;
      if (result.find("\n") != std::string::npos) {
        newline_pos = result.find("\n");

        /* Get current line from trimmed sub sequence */
        auto current_line = reduce(result.substr(0, newline_pos));

        /* Position of wifi_<macaddress> */
        auto pos = current_line.find(temp_start);

        /* Default check for std::string::npos */
        if (pos != std::string::npos) {
          /* pos==0 means that it is hidden and has no name*/
          if (pos != 0) {
            auto name = reduce(current_line.substr(0, pos));
            auto act_pos = name.find("*A");
            if (act_pos != std::string::npos) {
              name.erase(act_pos, act_pos + name.find_first_of(" ") + 1);
              active_name = name;
            }
            auto unique_name = current_line.substr(pos);
            service_names[name] = unique_name;
          } else {
            service_names["hidden - " + current_line.substr(0, 10)] =
                current_line;
          }
        } else {
        }
      }
      result.erase(0, newline_pos + 1);
    }
  }